

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  longlong lVar22;
  longlong lVar23;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar24 [16];
  ushort uVar28;
  int *in_stack_00000008;
  int in_stack_00000010;
  __m128i res_1_1;
  __m128i res_unsigned_16b_1;
  __m128i res_1;
  __m128i res_clip_1;
  __m128i res_16b_1;
  __m128i round_result_hi_1;
  __m128i round_result_lo_1;
  __m128i comp_avg_res_hi_1;
  __m128i comp_avg_res_lo_1;
  __m128i res_unsigned_hi_1;
  __m128i res_32b_hi_1;
  __m128i res_unsigned_lo_1;
  __m128i res_32b;
  __m128i data_ref_1;
  __m128i data_ref_0;
  __m128i data_1;
  __m128i data_0_1;
  __m128i res_2;
  __m128i src_10;
  __m128i src_row_1;
  __m128i src_row_0;
  __m128i res_unsigned_16b;
  __m128i res_clip;
  __m128i res_16b;
  __m128i round_result_hi;
  __m128i round_result_lo;
  __m128i comp_avg_res_hi;
  __m128i res_unsigned_hi;
  __m128i res_32b_hi;
  __m128i comp_avg_res_lo;
  __m128i res_unsigned_lo;
  __m128i res_32b_lo;
  __m128i data_ref_0_hi;
  __m128i data_ref_0_lo;
  __m128i data_0;
  __m128i res;
  __m128i src_16bit;
  __m128i clip_pixel_to_bd;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const_16b;
  __m128i offset_const;
  int offset;
  int offset_0;
  int j;
  int i;
  __m128i zero;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m128i left_shift;
  int bits;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined2 local_858;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_808;
  undefined8 uStack_800;
  longlong local_7d8 [2];
  longlong local_7c8 [2];
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  undefined2 local_7a8;
  undefined2 uStack_7a6;
  undefined2 uStack_7a4;
  undefined2 uStack_7a2;
  undefined2 uStack_7a0;
  undefined2 uStack_79e;
  undefined2 uStack_79c;
  undefined2 uStack_79a;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  undefined2 local_788;
  undefined2 uStack_786;
  undefined2 uStack_784;
  undefined2 uStack_782;
  undefined2 uStack_780;
  undefined2 uStack_77e;
  undefined2 uStack_77c;
  undefined2 uStack_77a;
  undefined2 local_778;
  undefined2 uStack_776;
  undefined2 uStack_774;
  undefined2 uStack_772;
  undefined2 uStack_770;
  undefined2 uStack_76e;
  undefined2 uStack_76c;
  undefined2 uStack_76a;
  undefined2 local_768;
  undefined2 uStack_766;
  undefined2 uStack_764;
  undefined2 uStack_762;
  undefined2 uStack_760;
  undefined2 uStack_75e;
  undefined2 uStack_75c;
  undefined2 uStack_75a;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 local_738 [16];
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined1 local_6f8 [16];
  ushort local_6e8;
  ushort uStack_6e6;
  ushort uStack_6e4;
  ushort uStack_6e2;
  ushort uStack_6e0;
  ushort uStack_6de;
  ushort uStack_6dc;
  ushort uStack_6da;
  undefined1 local_6d8 [16];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  longlong local_6a8 [2];
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  undefined2 local_688;
  undefined2 uStack_686;
  undefined2 uStack_684;
  undefined2 uStack_682;
  undefined2 uStack_680;
  undefined2 uStack_67e;
  undefined2 uStack_67c;
  undefined2 uStack_67a;
  longlong local_678 [2];
  int local_668;
  int iStack_664;
  int iStack_660;
  int iStack_65c;
  undefined2 local_658;
  undefined2 uStack_656;
  undefined2 uStack_654;
  undefined2 uStack_652;
  undefined2 uStack_650;
  undefined2 uStack_64e;
  undefined2 uStack_64c;
  undefined2 uStack_64a;
  undefined2 local_648;
  undefined2 uStack_646;
  undefined2 uStack_644;
  undefined2 uStack_642;
  undefined2 uStack_640;
  undefined2 uStack_63e;
  undefined2 uStack_63c;
  undefined2 uStack_63a;
  undefined2 local_638;
  undefined2 uStack_636;
  undefined2 uStack_634;
  undefined2 uStack_632;
  undefined2 uStack_630;
  undefined2 uStack_62e;
  undefined2 uStack_62c;
  undefined2 uStack_62a;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined1 local_618 [16];
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  longlong local_5e8;
  longlong lStack_5e0;
  int local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  longlong local_5b8;
  longlong lStack_5b0;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  longlong local_588;
  longlong lStack_580;
  longlong local_578;
  longlong lStack_570;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  ulong local_558;
  undefined8 uStack_550;
  uint local_540;
  int local_53c;
  long local_538;
  int local_52c;
  int local_528;
  int local_524;
  long local_520;
  int local_514;
  long local_510;
  undefined1 local_508 [16];
  uint local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined2 local_4bc;
  undefined2 local_4ba;
  undefined8 *local_4b8;
  undefined1 (*local_4b0) [16];
  ulong local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  ulong local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  longlong local_368;
  longlong lStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  longlong local_a8;
  longlong lStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  longlong local_88;
  longlong lStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  longlong local_68;
  longlong lStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_538 = *(long *)(in_stack_00000008 + 2);
  local_53c = in_stack_00000008[4];
  local_540 = 0xe - (in_stack_00000008[6] + in_stack_00000008[5]);
  local_508._4_4_ = 0;
  local_508._0_4_ = local_540;
  local_558 = local_508._0_8_;
  uStack_550 = 0;
  local_55c = *in_stack_00000008;
  local_560 = in_stack_00000008[9];
  local_564 = in_stack_00000008[10];
  local_568 = in_stack_00000008[0xb];
  local_578 = CONCAT44(local_564,local_564);
  lStack_570 = CONCAT44(local_564,local_564);
  local_588 = CONCAT44(local_568,local_568);
  lStack_580 = CONCAT44(local_568,local_568);
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_5a4 = ((in_stack_00000010 - in_stack_00000008[5]) - in_stack_00000008[6]) + 0xe;
  local_5a8 = (1 << ((byte)local_5a4 & 0x1f)) + (1 << ((byte)local_5a4 - 1 & 0x1f));
  local_5b8 = CONCAT44(local_5a8,local_5a8);
  lStack_5b0 = CONCAT44(local_5a8,local_5a8);
  local_4ba = (undefined2)local_5a8;
  local_2a = (undefined2)local_5a8;
  local_2c = (undefined2)local_5a8;
  local_2e = (undefined2)local_5a8;
  local_30 = (undefined2)local_5a8;
  local_32 = (undefined2)local_5a8;
  local_34 = (undefined2)local_5a8;
  local_36 = (undefined2)local_5a8;
  local_38 = (undefined2)local_5a8;
  local_5c8 = CONCAT26((undefined2)local_5a8,
                       CONCAT24((undefined2)local_5a8,
                                CONCAT22((undefined2)local_5a8,(undefined2)local_5a8)));
  uStack_5c0 = CONCAT26((undefined2)local_5a8,
                        CONCAT24((undefined2)local_5a8,
                                 CONCAT22((undefined2)local_5a8,(undefined2)local_5a8)));
  local_5cc = 0xe - (in_stack_00000008[5] + in_stack_00000008[6]);
  local_4e8 = (1 << ((byte)local_5cc & 0x1f)) >> 1;
  local_5e8 = CONCAT44(local_4e8,local_4e8);
  lStack_5e0 = CONCAT44(local_4e8,local_4e8);
  if (in_stack_00000010 == 10) {
    local_858 = 0x3ff;
  }
  else {
    local_858 = 0xff;
    if (in_stack_00000010 == 0xc) {
      local_858 = 0xfff;
    }
  }
  local_4bc = local_858;
  local_5f8 = CONCAT26(local_858,CONCAT24(local_858,CONCAT22(local_858,local_858)));
  uStack_5f0 = CONCAT26(local_858,CONCAT24(local_858,CONCAT22(local_858,local_858)));
  local_52c = in_R9D;
  local_528 = in_R8D;
  local_524 = in_ECX;
  local_520 = in_RDX;
  local_514 = in_ESI;
  local_510 = in_RDI;
  local_508 = ZEXT416(local_540);
  local_4ec = local_540;
  local_4e4 = local_5a8;
  local_4e0 = local_568;
  local_4dc = local_564;
  local_c8 = local_578;
  lStack_c0 = lStack_570;
  local_b8 = local_564;
  local_b4 = local_564;
  local_b0 = local_564;
  local_ac = local_564;
  local_a8 = local_588;
  lStack_a0 = lStack_580;
  local_98 = local_568;
  local_94 = local_568;
  local_90 = local_568;
  local_8c = local_568;
  local_88 = local_5b8;
  lStack_80 = lStack_5b0;
  local_78 = local_5a8;
  local_74 = local_5a8;
  local_70 = local_5a8;
  local_6c = local_5a8;
  local_68 = local_5e8;
  lStack_60 = lStack_5e0;
  local_58 = local_4e8;
  local_54 = local_4e8;
  local_50 = local_4e8;
  local_4c = local_4e8;
  local_48 = local_5c8;
  uStack_40 = uStack_5c0;
  local_28 = local_5f8;
  uStack_20 = uStack_5f0;
  local_10 = local_4bc;
  local_e = local_4bc;
  local_c = local_4bc;
  local_a = local_4bc;
  local_8 = local_4bc;
  local_6 = local_4bc;
  local_4 = local_4bc;
  local_2 = local_4bc;
  if (in_R8D % 8 == 0) {
    for (local_59c = 0; local_59c < local_52c; local_59c = local_59c + 1) {
      for (local_5a0 = 0; local_5a0 < local_528; local_5a0 = local_5a0 + 8) {
        local_4b0 = (undefined1 (*) [16])(local_510 + (long)(local_59c * local_514 + local_5a0) * 2)
        ;
        local_608 = *(undefined8 *)*local_4b0;
        uStack_600 = *(undefined8 *)(*local_4b0 + 8);
        local_488 = local_558;
        uStack_480 = uStack_550;
        auVar11._8_8_ = uStack_550;
        auVar11._0_8_ = local_558;
        local_618 = psllw(*local_4b0,auVar11);
        if (local_55c == 0) {
          local_1f8 = local_618._0_8_;
          uStack_1f0 = local_618._8_8_;
          local_208 = local_5c8;
          uStack_200 = uStack_5c0;
          auVar17._8_8_ = uStack_5c0;
          auVar17._0_8_ = local_5c8;
          local_6f8 = paddusw(local_618,auVar17);
          local_250 = (undefined8 *)(local_538 + (long)(local_59c * local_53c + local_5a0) * 2);
          local_268 = local_6f8._0_8_;
          uStack_260 = local_6f8._8_8_;
          *local_250 = local_6f8._0_8_;
          local_250[1] = local_6f8._8_8_;
        }
        else {
          local_4b8 = (undefined8 *)(local_538 + (long)(local_59c * local_53c + local_5a0) * 2);
          local_628 = *local_4b8;
          uStack_620 = local_4b8[1];
          local_3e8 = local_598;
          uVar9 = local_3e8;
          uStack_3e0 = uStack_590;
          local_3d8._0_2_ = (undefined2)local_628;
          local_3d8._2_2_ = (undefined2)((ulong)local_628 >> 0x10);
          local_3d8._4_2_ = (undefined2)((ulong)local_628 >> 0x20);
          local_3d8._6_2_ = (undefined2)((ulong)local_628 >> 0x30);
          local_3e8._0_2_ = (undefined2)local_598;
          local_3e8._2_2_ = (undefined2)((ulong)local_598 >> 0x10);
          local_3e8._4_2_ = (undefined2)((ulong)local_598 >> 0x20);
          local_3e8._6_2_ = (undefined2)((ulong)local_598 >> 0x30);
          local_638 = (undefined2)local_3d8;
          uStack_636 = (undefined2)local_3e8;
          uStack_634 = local_3d8._2_2_;
          uStack_632 = local_3e8._2_2_;
          uStack_630 = local_3d8._4_2_;
          uStack_62e = local_3e8._4_2_;
          uStack_62c = local_3d8._6_2_;
          uStack_62a = local_3e8._6_2_;
          local_388 = local_598;
          uStack_380 = uStack_590;
          uVar18 = uStack_380;
          uStack_370._0_2_ = (undefined2)uStack_620;
          uStack_370._2_2_ = (undefined2)((ulong)uStack_620 >> 0x10);
          uStack_370._4_2_ = (undefined2)((ulong)uStack_620 >> 0x20);
          uStack_370._6_2_ = (undefined2)((ulong)uStack_620 >> 0x30);
          uStack_380._0_2_ = (undefined2)uStack_590;
          uStack_380._2_2_ = (undefined2)((ulong)uStack_590 >> 0x10);
          uStack_380._4_2_ = (undefined2)((ulong)uStack_590 >> 0x20);
          uStack_380._6_2_ = (undefined2)((ulong)uStack_590 >> 0x30);
          local_648 = (undefined2)uStack_370;
          uStack_646 = (undefined2)uStack_380;
          uStack_644 = uStack_370._2_2_;
          uStack_642 = uStack_380._2_2_;
          uStack_640 = uStack_370._4_2_;
          uStack_63e = uStack_380._4_2_;
          uStack_63c = uStack_370._6_2_;
          uStack_63a = uStack_380._6_2_;
          local_3f8 = local_618._0_8_;
          uVar8 = local_3f8;
          uStack_3f0 = local_618._8_8_;
          local_408 = local_598;
          uStack_400 = uStack_590;
          local_3f8._0_2_ = local_618._0_2_;
          local_3f8._2_2_ = local_618._2_2_;
          local_3f8._4_2_ = local_618._4_2_;
          local_3f8._6_2_ = local_618._6_2_;
          local_658 = (undefined2)local_3f8;
          uStack_656 = (undefined2)local_3e8;
          uStack_654 = local_3f8._2_2_;
          uStack_652 = local_3e8._2_2_;
          uStack_650 = local_3f8._4_2_;
          uStack_64e = local_3e8._4_2_;
          uStack_64c = local_3f8._6_2_;
          uStack_64a = local_3e8._6_2_;
          uVar6 = CONCAT26(local_3e8._2_2_,
                           CONCAT24(local_3f8._2_2_,
                                    CONCAT22((undefined2)local_3e8,(undefined2)local_3f8)));
          uVar7 = CONCAT26(local_3e8._6_2_,
                           CONCAT24(local_3f8._6_2_,CONCAT22(local_3e8._4_2_,local_3f8._4_2_)));
          local_308 = local_5b8;
          lVar22 = local_308;
          uStack_300 = lStack_5b0;
          lVar23 = uStack_300;
          local_2f8._4_4_ = (int)((ulong)uVar6 >> 0x20);
          uStack_2f0._4_4_ = (int)((ulong)uVar7 >> 0x20);
          local_308._0_4_ = (int)local_5b8;
          local_308._4_4_ = (int)((ulong)local_5b8 >> 0x20);
          uStack_300._0_4_ = (int)lStack_5b0;
          uStack_300._4_4_ = (int)((ulong)lStack_5b0 >> 0x20);
          local_668 = CONCAT22((undefined2)local_3e8,(undefined2)local_3f8) + (int)local_308;
          iStack_664 = local_2f8._4_4_ + local_308._4_4_;
          iStack_660 = CONCAT22(local_3e8._4_2_,local_3f8._4_2_) + (int)uStack_300;
          iStack_65c = uStack_2f0._4_4_ + uStack_300._4_4_;
          local_478 = local_608;
          uStack_470 = uStack_600;
          local_3f8 = uVar8;
          local_3e8 = uVar9;
          local_3d8 = local_628;
          uStack_3d0 = uStack_620;
          uStack_380 = uVar18;
          local_378 = local_628;
          uStack_370 = uStack_620;
          local_308 = lVar22;
          uStack_300 = lVar23;
          local_2f8 = uVar6;
          uStack_2f0 = uVar7;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_638,(__m128i *)&local_668,(__m128i *)&local_578,
                     (__m128i *)&local_588,local_560);
          local_398 = local_618._0_8_;
          uStack_390 = local_618._8_8_;
          uVar9 = uStack_390;
          local_3a8 = local_598;
          uStack_3a0 = uStack_590;
          uVar8 = uStack_3a0;
          uStack_390._0_2_ = local_618._8_2_;
          uStack_390._2_2_ = local_618._10_2_;
          uStack_390._4_2_ = local_618._12_2_;
          uStack_390._6_2_ = local_618._14_2_;
          uStack_3a0._0_2_ = (undefined2)uStack_590;
          uStack_3a0._2_2_ = (undefined2)((ulong)uStack_590 >> 0x10);
          uStack_3a0._4_2_ = (undefined2)((ulong)uStack_590 >> 0x20);
          uStack_3a0._6_2_ = (undefined2)((ulong)uStack_590 >> 0x30);
          local_688 = (undefined2)uStack_390;
          uStack_686 = (undefined2)uStack_3a0;
          uStack_684 = uStack_390._2_2_;
          uStack_682 = uStack_3a0._2_2_;
          uStack_680 = uStack_390._4_2_;
          uStack_67e = uStack_3a0._4_2_;
          uStack_67c = uStack_390._6_2_;
          uStack_67a = uStack_3a0._6_2_;
          uVar6 = CONCAT26(uStack_3a0._2_2_,
                           CONCAT24(uStack_390._2_2_,
                                    CONCAT22((undefined2)uStack_3a0,(undefined2)uStack_390)));
          uVar7 = CONCAT26(uStack_3a0._6_2_,
                           CONCAT24(uStack_390._6_2_,CONCAT22(uStack_3a0._4_2_,uStack_390._4_2_)));
          local_328 = local_5b8;
          lVar22 = local_328;
          uStack_320 = lStack_5b0;
          lVar23 = uStack_320;
          local_318._4_4_ = (int)((ulong)uVar6 >> 0x20);
          uStack_310._4_4_ = (int)((ulong)uVar7 >> 0x20);
          local_328._0_4_ = (int)local_5b8;
          local_328._4_4_ = (int)((ulong)local_5b8 >> 0x20);
          uStack_320._0_4_ = (int)lStack_5b0;
          uStack_320._4_4_ = (int)((ulong)lStack_5b0 >> 0x20);
          local_698 = CONCAT22((undefined2)uStack_3a0,(undefined2)uStack_390) + (int)local_328;
          iStack_694 = local_318._4_4_ + local_328._4_4_;
          iStack_690 = CONCAT22(uStack_3a0._4_2_,uStack_390._4_2_) + (int)uStack_320;
          iStack_68c = uStack_310._4_4_ + uStack_320._4_4_;
          uStack_3a0 = uVar8;
          uStack_390 = uVar9;
          local_328 = lVar22;
          uStack_320 = lVar23;
          local_318 = uVar6;
          uStack_310 = uVar7;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_648,(__m128i *)&local_698,(__m128i *)&local_578,
                     (__m128i *)&local_588,local_560);
          highbd_convolve_rounding_sse2
                    (&local_678,(__m128i *)&local_5b8,(__m128i *)&local_5e8,local_5cc);
          local_6b8 = extraout_XMM0_Qa;
          uStack_6b0 = extraout_XMM0_Qb;
          highbd_convolve_rounding_sse2
                    (&local_6a8,(__m128i *)&local_5b8,(__m128i *)&local_5e8,local_5cc);
          local_2b8 = local_6b8;
          uStack_2b0 = uStack_6b0;
          auVar15._8_8_ = uStack_6b0;
          auVar15._0_8_ = local_6b8;
          auVar14._8_8_ = extraout_XMM0_Qb_00;
          auVar14._0_8_ = extraout_XMM0_Qa_00;
          local_6d8 = packusdw(auVar15,auVar14);
          local_278 = local_6d8._0_8_;
          uVar8 = local_278;
          uStack_270 = local_6d8._8_8_;
          uVar9 = uStack_270;
          local_288 = local_5f8;
          uVar6 = local_288;
          uStack_280 = uStack_5f0;
          uVar7 = uStack_280;
          local_278._0_2_ = local_6d8._0_2_;
          local_278._2_2_ = local_6d8._2_2_;
          local_278._4_2_ = local_6d8._4_2_;
          local_278._6_2_ = local_6d8._6_2_;
          uStack_270._0_2_ = local_6d8._8_2_;
          uStack_270._2_2_ = local_6d8._10_2_;
          uStack_270._4_2_ = local_6d8._12_2_;
          uStack_270._6_2_ = local_6d8._14_2_;
          local_288._0_2_ = (short)local_5f8;
          local_288._2_2_ = (short)((ulong)local_5f8 >> 0x10);
          local_288._4_2_ = (short)((ulong)local_5f8 >> 0x20);
          local_288._6_2_ = (short)((ulong)local_5f8 >> 0x30);
          uStack_280._0_2_ = (short)uStack_5f0;
          uStack_280._2_2_ = (short)((ulong)uStack_5f0 >> 0x10);
          uStack_280._4_2_ = (short)((ulong)uStack_5f0 >> 0x20);
          uStack_280._6_2_ = (short)((ulong)uStack_5f0 >> 0x30);
          local_6e8 = (ushort)((short)local_288 < (short)local_278) * (short)local_288 |
                      (ushort)((short)local_288 >= (short)local_278) * (short)local_278;
          uStack_6e6 = (ushort)(local_288._2_2_ < local_278._2_2_) * local_288._2_2_ |
                       (ushort)(local_288._2_2_ >= local_278._2_2_) * local_278._2_2_;
          uStack_6e4 = (ushort)(local_288._4_2_ < local_278._4_2_) * local_288._4_2_ |
                       (ushort)(local_288._4_2_ >= local_278._4_2_) * local_278._4_2_;
          uStack_6e2 = (ushort)(local_288._6_2_ < local_278._6_2_) * local_288._6_2_ |
                       (ushort)(local_288._6_2_ >= local_278._6_2_) * local_278._6_2_;
          uStack_6e0 = (ushort)((short)uStack_280 < (short)uStack_270) * (short)uStack_280 |
                       (ushort)((short)uStack_280 >= (short)uStack_270) * (short)uStack_270;
          uStack_6de = (ushort)(uStack_280._2_2_ < uStack_270._2_2_) * uStack_280._2_2_ |
                       (ushort)(uStack_280._2_2_ >= uStack_270._2_2_) * uStack_270._2_2_;
          uStack_6dc = (ushort)(uStack_280._4_2_ < uStack_270._4_2_) * uStack_280._4_2_ |
                       (ushort)(uStack_280._4_2_ >= uStack_270._4_2_) * uStack_270._4_2_;
          uStack_6da = (ushort)(uStack_280._6_2_ < uStack_270._6_2_) * uStack_280._6_2_ |
                       (ushort)(uStack_280._6_2_ >= uStack_270._6_2_) * uStack_270._6_2_;
          local_230 = (undefined8 *)(local_520 + (long)(local_59c * local_524 + local_5a0) * 2);
          local_248 = CONCAT26(uStack_6e2,CONCAT24(uStack_6e4,CONCAT22(uStack_6e6,local_6e8)));
          uStack_240 = CONCAT26(uStack_6da,CONCAT24(uStack_6dc,CONCAT22(uStack_6de,uStack_6e0)));
          *local_230 = local_248;
          local_230[1] = uStack_240;
          local_288 = uVar6;
          uStack_280 = uVar7;
          local_278 = uVar8;
          uStack_270 = uVar9;
        }
      }
    }
  }
  else if (in_R8D % 4 == 0) {
    for (local_59c = 0; local_59c < local_52c; local_59c = local_59c + 2) {
      for (local_5a0 = 0; local_5a0 < local_528; local_5a0 = local_5a0 + 4) {
        local_170 = (undefined8 *)(local_510 + (long)(local_59c * local_514 + local_5a0) * 2);
        local_728 = *local_170;
        uStack_180 = 0;
        uStack_700 = 0;
        local_190 = (undefined8 *)
                    (local_510 + (long)(local_59c * local_514 + local_5a0 + local_514) * 2);
        uStack_720 = *local_190;
        uStack_1a0 = 0;
        uStack_710 = 0;
        uStack_150 = 0;
        uStack_160 = 0;
        local_4a8 = local_558;
        uStack_4a0 = uStack_550;
        auVar10._8_8_ = uStack_720;
        auVar10._0_8_ = local_728;
        auVar24._8_8_ = uStack_550;
        auVar24._0_8_ = local_558;
        local_738 = psllw(auVar10,auVar24);
        if (local_55c == 0) {
          local_218 = local_738._0_8_;
          uStack_210 = local_738._8_8_;
          local_228 = local_5c8;
          uStack_220 = uStack_5c0;
          auVar16._8_8_ = uStack_5c0;
          auVar16._0_8_ = local_5c8;
          auVar24 = paddusw(local_738,auVar16);
          uStack_830 = auVar24._8_8_;
          local_110 = (undefined8 *)(local_538 + (long)(local_59c * local_53c + local_5a0) * 2);
          local_838 = auVar24._0_8_;
          local_128 = local_838;
          uStack_120 = uStack_830;
          *local_110 = local_838;
          local_130 = (undefined8 *)
                      (local_538 + (long)(local_59c * local_53c + local_5a0 + local_53c) * 2);
          local_148 = uStack_830;
          uStack_140 = 0;
          *local_130 = uStack_830;
        }
        else {
          local_1b0 = (undefined8 *)(local_538 + (long)(local_59c * local_53c + local_5a0) * 2);
          local_748 = *local_1b0;
          uStack_1c0 = 0;
          uStack_740 = 0;
          local_1d0 = (undefined8 *)
                      (local_538 + (long)(local_59c * local_53c + local_5a0 + local_53c) * 2);
          local_758 = *local_1d0;
          uStack_1e0 = 0;
          uStack_750 = 0;
          uStack_410 = 0;
          local_428 = local_598;
          uVar19 = local_428;
          uStack_420 = uStack_590;
          local_418._0_2_ = (undefined2)local_748;
          local_418._2_2_ = (undefined2)((ulong)local_748 >> 0x10);
          local_418._4_2_ = (undefined2)((ulong)local_748 >> 0x20);
          local_418._6_2_ = (undefined2)((ulong)local_748 >> 0x30);
          local_428._0_2_ = (undefined2)local_598;
          local_428._2_2_ = (undefined2)((ulong)local_598 >> 0x10);
          local_428._4_2_ = (undefined2)((ulong)local_598 >> 0x20);
          local_428._6_2_ = (undefined2)((ulong)local_598 >> 0x30);
          local_768 = (undefined2)local_418;
          uStack_766 = (undefined2)local_428;
          uStack_764 = local_418._2_2_;
          uStack_762 = local_428._2_2_;
          uStack_760 = local_418._4_2_;
          uStack_75e = local_428._4_2_;
          uStack_75c = local_418._6_2_;
          uStack_75a = local_428._6_2_;
          uStack_430 = 0;
          local_448 = local_598;
          uStack_440 = uStack_590;
          local_438._0_2_ = (undefined2)local_758;
          local_438._2_2_ = (undefined2)((ulong)local_758 >> 0x10);
          local_438._4_2_ = (undefined2)((ulong)local_758 >> 0x20);
          local_438._6_2_ = (undefined2)((ulong)local_758 >> 0x30);
          local_778 = (undefined2)local_438;
          uStack_776 = (undefined2)local_428;
          uStack_774 = local_438._2_2_;
          uStack_772 = local_428._2_2_;
          uStack_770 = local_438._4_2_;
          uStack_76e = local_428._4_2_;
          uStack_76c = local_438._6_2_;
          uStack_76a = local_428._6_2_;
          local_458 = local_738._0_8_;
          uVar18 = local_458;
          uStack_450 = local_738._8_8_;
          local_468 = local_598;
          uStack_460 = uStack_590;
          local_458._0_2_ = local_738._0_2_;
          local_458._2_2_ = local_738._2_2_;
          local_458._4_2_ = local_738._4_2_;
          local_458._6_2_ = local_738._6_2_;
          local_788 = (undefined2)local_458;
          uStack_786 = (undefined2)local_428;
          uStack_784 = local_458._2_2_;
          uStack_782 = local_428._2_2_;
          uStack_780 = local_458._4_2_;
          uStack_77e = local_428._4_2_;
          uStack_77c = local_458._6_2_;
          uStack_77a = local_428._6_2_;
          uVar8 = CONCAT26(local_428._2_2_,
                           CONCAT24(local_458._2_2_,
                                    CONCAT22((undefined2)local_428,(undefined2)local_458)));
          uVar9 = CONCAT26(local_428._6_2_,
                           CONCAT24(local_458._6_2_,CONCAT22(local_428._4_2_,local_458._4_2_)));
          local_348 = local_5b8;
          lVar22 = local_348;
          uStack_340 = lStack_5b0;
          lVar23 = uStack_340;
          local_338._4_4_ = (int)((ulong)uVar8 >> 0x20);
          uStack_330._4_4_ = (int)((ulong)uVar9 >> 0x20);
          local_348._0_4_ = (int)local_5b8;
          local_348._4_4_ = (int)((ulong)local_5b8 >> 0x20);
          uStack_340._0_4_ = (int)lStack_5b0;
          uStack_340._4_4_ = (int)((ulong)lStack_5b0 >> 0x20);
          local_798 = CONCAT22((undefined2)local_428,(undefined2)local_458) + (int)local_348;
          iStack_794 = local_338._4_4_ + local_348._4_4_;
          iStack_790 = CONCAT22(local_428._4_2_,local_458._4_2_) + (int)uStack_340;
          iStack_78c = uStack_330._4_4_ + uStack_340._4_4_;
          local_3b8 = local_738._0_8_;
          uStack_3b0 = local_738._8_8_;
          uVar21 = uStack_3b0;
          local_3c8 = local_598;
          uStack_3c0 = uStack_590;
          uVar20 = uStack_3c0;
          uStack_3b0._0_2_ = local_738._8_2_;
          uStack_3b0._2_2_ = local_738._10_2_;
          uStack_3b0._4_2_ = local_738._12_2_;
          uStack_3b0._6_2_ = local_738._14_2_;
          uStack_3c0._0_2_ = (undefined2)uStack_590;
          uStack_3c0._2_2_ = (undefined2)((ulong)uStack_590 >> 0x10);
          uStack_3c0._4_2_ = (undefined2)((ulong)uStack_590 >> 0x20);
          uStack_3c0._6_2_ = (undefined2)((ulong)uStack_590 >> 0x30);
          local_7a8 = (undefined2)uStack_3b0;
          uStack_7a6 = (undefined2)uStack_3c0;
          uStack_7a4 = uStack_3b0._2_2_;
          uStack_7a2 = uStack_3c0._2_2_;
          uStack_7a0 = uStack_3b0._4_2_;
          uStack_79e = uStack_3c0._4_2_;
          uStack_79c = uStack_3b0._6_2_;
          uStack_79a = uStack_3c0._6_2_;
          uVar6 = CONCAT26(uStack_3c0._2_2_,
                           CONCAT24(uStack_3b0._2_2_,
                                    CONCAT22((undefined2)uStack_3c0,(undefined2)uStack_3b0)));
          uVar7 = CONCAT26(uStack_3c0._6_2_,
                           CONCAT24(uStack_3b0._6_2_,CONCAT22(uStack_3c0._4_2_,uStack_3b0._4_2_)));
          local_368 = local_5b8;
          lStack_360 = lStack_5b0;
          local_358._4_4_ = (int)((ulong)uVar6 >> 0x20);
          uStack_350._4_4_ = (int)((ulong)uVar7 >> 0x20);
          local_7b8 = CONCAT22((undefined2)uStack_3c0,(undefined2)uStack_3b0) + (int)local_348;
          iStack_7b4 = local_358._4_4_ + local_348._4_4_;
          iStack_7b0 = CONCAT22(uStack_3c0._4_2_,uStack_3b0._4_2_) + (int)uStack_340;
          iStack_7ac = uStack_350._4_4_ + uStack_340._4_4_;
          local_718 = uStack_720;
          local_708 = local_728;
          local_498 = local_728;
          uStack_490 = uStack_720;
          local_458 = uVar18;
          local_438 = local_758;
          local_428 = uVar19;
          local_418 = local_748;
          uStack_3c0 = uVar20;
          uStack_3b0 = uVar21;
          local_358 = uVar6;
          uStack_350 = uVar7;
          local_348 = lVar22;
          uStack_340 = lVar23;
          local_338 = uVar8;
          uStack_330 = uVar9;
          local_1e8 = local_758;
          local_1c8 = local_748;
          local_1a8 = uStack_720;
          local_188 = local_728;
          local_168 = uStack_720;
          local_158 = local_728;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_768,(__m128i *)&local_798,(__m128i *)&local_578,
                     (__m128i *)&local_588,local_560);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_778,(__m128i *)&local_7b8,(__m128i *)&local_578,
                     (__m128i *)&local_588,local_560);
          highbd_convolve_rounding_sse2
                    (&local_7c8,(__m128i *)&local_5b8,(__m128i *)&local_5e8,local_5cc);
          highbd_convolve_rounding_sse2
                    (&local_7d8,(__m128i *)&local_5b8,(__m128i *)&local_5e8,local_5cc);
          auVar13._8_8_ = extraout_XMM0_Qb_01;
          auVar13._0_8_ = extraout_XMM0_Qa_01;
          auVar12._8_8_ = extraout_XMM0_Qb_02;
          auVar12._0_8_ = extraout_XMM0_Qa_02;
          auVar24 = packusdw(auVar13,auVar12);
          local_808 = auVar24._0_8_;
          uStack_800 = auVar24._8_8_;
          local_298 = local_808;
          uVar6 = local_298;
          uStack_290 = uStack_800;
          uVar7 = uStack_290;
          local_2a8 = local_5f8;
          uStack_2a0 = uStack_5f0;
          local_298._0_2_ = auVar24._0_2_;
          local_298._2_2_ = auVar24._2_2_;
          local_298._4_2_ = auVar24._4_2_;
          local_298._6_2_ = auVar24._6_2_;
          uStack_290._0_2_ = auVar24._8_2_;
          uStack_290._2_2_ = auVar24._10_2_;
          uStack_290._4_2_ = auVar24._12_2_;
          uStack_290._6_2_ = auVar24._14_2_;
          sVar1 = (short)local_5f8;
          sVar2 = (short)((ulong)local_5f8 >> 0x10);
          sVar3 = (short)((ulong)local_5f8 >> 0x20);
          sVar4 = (short)((ulong)local_5f8 >> 0x30);
          sVar5 = (short)uStack_5f0;
          uVar25 = (ushort)(sVar5 < (short)uStack_290) * sVar5 |
                   (ushort)(sVar5 >= (short)uStack_290) * (short)uStack_290;
          sVar5 = (short)((ulong)uStack_5f0 >> 0x10);
          uVar26 = (ushort)(sVar5 < uStack_290._2_2_) * sVar5 |
                   (ushort)(sVar5 >= uStack_290._2_2_) * uStack_290._2_2_;
          sVar5 = (short)((ulong)uStack_5f0 >> 0x20);
          uVar27 = (ushort)(sVar5 < uStack_290._4_2_) * sVar5 |
                   (ushort)(sVar5 >= uStack_290._4_2_) * uStack_290._4_2_;
          sVar5 = (short)((ulong)uStack_5f0 >> 0x30);
          uVar28 = (ushort)(sVar5 < uStack_290._6_2_) * sVar5 |
                   (ushort)(sVar5 >= uStack_290._6_2_) * uStack_290._6_2_;
          local_108 = CONCAT26(uVar28,CONCAT24(uVar27,CONCAT22(uVar26,uVar25)));
          local_d0 = (undefined8 *)(local_520 + (long)(local_59c * local_524 + local_5a0) * 2);
          local_e8 = CONCAT26((ushort)(sVar4 < local_298._6_2_) * sVar4 |
                              (ushort)(sVar4 >= local_298._6_2_) * local_298._6_2_,
                              CONCAT24((ushort)(sVar3 < local_298._4_2_) * sVar3 |
                                       (ushort)(sVar3 >= local_298._4_2_) * local_298._4_2_,
                                       CONCAT22((ushort)(sVar2 < local_298._2_2_) * sVar2 |
                                                (ushort)(sVar2 >= local_298._2_2_) * local_298._2_2_
                                                ,(ushort)(sVar1 < (short)local_298) * sVar1 |
                                                 (ushort)(sVar1 >= (short)local_298) *
                                                 (short)local_298)));
          uStack_e0 = CONCAT26(uVar28,CONCAT24(uVar27,CONCAT22(uVar26,uVar25)));
          *local_d0 = local_e8;
          local_f0 = (undefined8 *)
                     (local_520 + (long)(local_59c * local_524 + local_5a0 + local_524) * 2);
          uStack_100 = 0;
          *local_f0 = local_108;
          local_298 = uVar6;
          uStack_290 = uVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1(const uint16_t *src,
                                                 int src_stride, uint16_t *dst0,
                                                 int dst_stride0, int w, int h,
                                                 ConvolveParams *conv_params,
                                                 int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const __m128i offset_const_16b = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 8)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_16bit =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i res = _mm_sll_epi16(src_16bit, left_shift);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i res_32b_lo = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo =
              _mm_add_epi32(res_32b_lo, offset_const);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]),
                          res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 4) {
        const __m128i src_row_0 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j + src_stride]));
        const __m128i src_10 = _mm_unpacklo_epi64(src_row_0, src_row_1);

        const __m128i res = _mm_sll_epi16(src_10, left_shift);

        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_1 = _mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

          const __m128i res_32b = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo = _mm_add_epi32(res_32b, offset_const);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_lo = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi = highbd_comp_avg_sse4_1(
              &data_ref_1, &res_unsigned_hi, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_1 = _mm_srli_si128(res_clip, 8);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          const __m128i res_1 = _mm_srli_si128(res_unsigned_16b, 8);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]),
                           res_unsigned_16b);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      }
    }
  }
}